

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModelMultiSorted.hpp
# Opt level: O3

void __thiscall
FMB::FiniteModelMultiSorted::FiniteModelMultiSorted
          (FiniteModelMultiSorted *this,DArray<unsigned_int> *sortSizes)

{
  Lib::DArray<unsigned_int>::DArray(&this->_sizes,sortSizes);
  (this->sortRepr)._size = 0;
  (this->sortRepr)._capacity = 0;
  (this->_p_interpretation)._capacity = 0;
  (this->_p_interpretation)._array = (char *)0x0;
  (this->_f_interpretation)._array = (uint *)0x0;
  (this->_p_interpretation)._size = 0;
  (this->_f_interpretation)._size = 0;
  (this->_f_interpretation)._capacity = 0;
  (this->_p_offsets)._capacity = 0;
  (this->_p_offsets)._array = (uint *)0x0;
  (this->_f_offsets)._array = (uint *)0x0;
  (this->_p_offsets)._size = 0;
  (this->_f_offsets)._size = 0;
  (this->_f_offsets)._capacity = 0;
  (this->sortRepr)._array = (DArray<int> *)0x0;
  (this->_domainConstants)._timestamp = 1;
  (this->_domainConstants)._size = 0;
  (this->_domainConstants)._deleted = 0;
  (this->_domainConstants)._capacityIndex = 0;
  (this->_domainConstants)._capacity = 0;
  *(undefined8 *)&(this->_domainConstants)._nextExpansionOccupancy = 0;
  *(undefined8 *)((long)&(this->_domainConstants)._entries + 4) = 0;
  *(undefined8 *)((long)&(this->_domainConstants)._afterLast + 4) = 0x100000000;
  (this->_domainConstantsRev)._size = 0;
  (this->_domainConstantsRev)._deleted = 0;
  (this->_domainConstantsRev)._capacityIndex = 0;
  (this->_domainConstantsRev)._capacity = 0;
  *(undefined8 *)&(this->_domainConstantsRev)._nextExpansionOccupancy = 0;
  *(undefined8 *)((long)&(this->_domainConstantsRev)._entries + 4) = 0;
  *(undefined4 *)((long)&(this->_domainConstantsRev)._afterLast + 4) = 0;
  initTables(this);
  return;
}

Assistant:

FiniteModelMultiSorted(DArray<unsigned> sortSizes) : _sizes(sortSizes) {
    initTables();
  }